

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

LexerState * lexer_OpenFile(char *path)

{
  int iVar1;
  int iVar2;
  LexerState *__ptr;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  char *fmt;
  stat fileInfo;
  stat sStack_b8;
  
  iVar1 = strcmp(path,"-");
  __ptr = (LexerState *)malloc(0xb8);
  pcVar5 = "<stdin>";
  if (iVar1 != 0) {
    pcVar5 = path;
  }
  if (__ptr == (LexerState *)0x0) {
    piVar3 = __errno_location();
    pcVar5 = strerror(*piVar3);
    error("Failed to allocate memory for lexer state: %s\n",pcVar5);
    return (LexerState *)0x0;
  }
  if (iVar1 == 0) {
    __ptr->path = pcVar5;
    __ptr->isFile = true;
    iVar2 = 0;
  }
  else {
    iVar2 = stat(pcVar5,&sStack_b8);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fmt = "Failed to stat file \"%s\": %s\n";
      goto LAB_0010c9fa;
    }
    __ptr->path = pcVar5;
    __ptr->isFile = true;
    iVar2 = open(pcVar5,0);
  }
  (__ptr->field_2).field_1.fd = iVar2;
  if (-1 < iVar2) {
    __ptr->isMmapped = false;
    if (0 < sStack_b8.st_size && iVar1 != 0) {
      pcVar4 = (char *)mmap((void *)0x0,sStack_b8.st_size,1,2,iVar2,0);
      if (pcVar4 == (char *)0xffffffffffffffff) {
        piVar3 = __errno_location();
        pcVar4 = (char *)0xffffffffffffffff;
        if (*piVar3 == 0x5f) {
          if (verbose == true) {
            printf("mmap(%s, MAP_PRIVATE) failed, retrying with MAP_SHARED\n",__ptr->path);
          }
          pcVar4 = (char *)mmap((void *)0x0,sStack_b8.st_size,1,1,(__ptr->field_2).field_1.fd,0);
        }
      }
      if (pcVar4 == (char *)0xffffffffffffffff) {
        __ptr->isMmapped = false;
      }
      else {
        close((__ptr->field_2).field_1.fd);
        __ptr->isMmapped = true;
        (__ptr->field_2).field_0.isReferenced = false;
        (__ptr->field_2).field_0.ptr = pcVar4;
        if (sStack_b8.st_size < 0) {
          __assert_fail("fileInfo.st_size >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                        ,0x1e3,"lexer_OpenFile");
        }
        (__ptr->field_2).field_0.size = sStack_b8.st_size;
        (__ptr->field_2).field_0.offset = 0;
        if (verbose == true) {
          printf("File %s successfully mmap()ped\n",pcVar5);
        }
      }
    }
    if (__ptr->isMmapped == false) {
      if (verbose == true) {
        if (iVar1 == 0) {
          puts("Opening stdin");
        }
        else if (sStack_b8.st_size == 0) {
          printf("File %s is empty\n",pcVar5);
        }
        else {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          printf("File %s opened as regular, errno reports \"%s\"\n",pcVar5,pcVar4);
        }
      }
      (__ptr->field_2).field_0.size = 0;
      (__ptr->field_2).field_1.nbChars = 0;
    }
    __ptr->mode = LEXER_NORMAL;
    __ptr->atLineStart = true;
    __ptr->lastToken = 0;
    __ptr->ifStack = (IfStack *)0x0;
    __ptr->capturing = false;
    __ptr->captureBuf = (char *)0x0;
    __ptr->disableMacroArgs = false;
    __ptr->disableInterpolation = false;
    __ptr->macroArgScanDistance = 0;
    __ptr->expandStrings = true;
    __ptr->expansions = (Expansion *)0x0;
    __ptr->lineNo = 0;
    return __ptr;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fmt = "Failed to open file \"%s\": %s\n";
LAB_0010c9fa:
  error(fmt,pcVar5,pcVar4);
  free(__ptr);
  return (LexerState *)0x0;
}

Assistant:

struct LexerState *lexer_OpenFile(char const *path)
{
	bool isStdin = !strcmp(path, "-");
	struct LexerState *state = (struct LexerState *)malloc(sizeof(*state));
	struct stat fileInfo;

	// Give stdin a nicer file name
	if (isStdin)
		path = "<stdin>";
	if (!state) {
		error("Failed to allocate memory for lexer state: %s\n", strerror(errno));
		return NULL;
	}
	if (!isStdin && stat(path, &fileInfo) != 0) {
		error("Failed to stat file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->path = path;
	state->isFile = true;
	state->fd = isStdin ? STDIN_FILENO : open(path, O_RDONLY);
	if (state->fd < 0) {
		error("Failed to open file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->isMmapped = false; // By default, assume it won't be mmap()ed
	if (!isStdin && fileInfo.st_size > 0) {
		// Try using `mmap` for better performance

		// Important: do NOT assign to `state->ptr` directly, to avoid a cast that may
		// alter an eventual `MAP_FAILED` value. It would also invalidate `state->fd`,
		// being on the other side of the union.
		void *mappingAddr;

		mapFile(mappingAddr, state->fd, state->path, fileInfo.st_size);
		if (mappingAddr == MAP_FAILED) {
			// If mmap()ing failed, try again using another method (below)
			state->isMmapped = false;
		} else {
			// IMPORTANT: the `union` mandates this is accessed before other members!
			close(state->fd);

			state->isMmapped = true;
			state->isReferenced = false; // By default, a state isn't referenced
			state->ptr = (char *)mappingAddr;
			assert(fileInfo.st_size >= 0);
			state->size = (size_t)fileInfo.st_size;
			state->offset = 0;

			if (verbose)
				printf("File %s successfully mmap()ped\n", path);
		}
	}
	if (!state->isMmapped) {
		// Sometimes mmap() fails or isn't available, so have a fallback
		if (verbose) {
			if (isStdin)
				printf("Opening stdin\n");
			else if (fileInfo.st_size == 0)
				printf("File %s is empty\n", path);
			else
				printf("File %s opened as regular, errno reports \"%s\"\n",
				       path, strerror(errno));
		}
		state->index = 0;
		state->nbChars = 0;
	}

	initState(state);
	state->lineNo = 0; // Will be incremented at first line start
	return state;
}